

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O1

void __thiscall HEkkDual::majorUpdateFactor(HEkkDual *this)

{
  int iVar1;
  HEkk *pHVar2;
  uint uVar3;
  HighsInt *iRow;
  HVector_ptr *ppHVar4;
  ulong uVar5;
  long lVar6;
  
  iVar1 = this->multi_nFinish;
  lVar6 = (long)iVar1;
  uVar5 = 0xffffffffffffffff;
  if (-1 < lVar6) {
    uVar5 = lVar6 * 4;
  }
  iRow = (HighsInt *)operator_new__(uVar5);
  uVar3 = iVar1 - 1;
  if (1 < lVar6) {
    ppHVar4 = &this->multi_finish[1].col_aq;
    uVar5 = 0;
    do {
      *(HVector_ptr *)((long)ppHVar4[-0x10] + 0x70) = ppHVar4[-1];
      *(HVector_ptr *)((long)ppHVar4[-0xf] + 0x70) = *ppHVar4;
      iRow[uVar5] = *(HighsInt *)(ppHVar4 + -0x17);
      uVar5 = uVar5 + 1;
      ppHVar4 = ppHVar4 + 0xf;
    } while (uVar3 != uVar5);
  }
  iRow[(int)uVar3] = this->multi_finish[(int)uVar3].row_out;
  if (0 < iVar1) {
    HEkk::updateFactor(this->ekk_instance_,this->multi_finish[0].col_aq,this->multi_finish[0].row_ep
                       ,iRow,&this->rebuild_reason);
  }
  pHVar2 = this->ekk_instance_;
  if ((pHVar2->build_synthetic_tick_ <= pHVar2->total_synthetic_tick_) &&
     (0x31 < (pHVar2->info_).update_count)) {
    this->rebuild_reason = 2;
  }
  operator_delete__(iRow);
  return;
}

Assistant:

void HEkkDual::majorUpdateFactor() {
  /**
   * 9. Update the factor by CFT
   */
  HighsInt* iRows = new HighsInt[multi_nFinish];
  for (HighsInt iCh = 0; iCh < multi_nFinish - 1; iCh++) {
    multi_finish[iCh].row_ep->next = multi_finish[iCh + 1].row_ep;
    multi_finish[iCh].col_aq->next = multi_finish[iCh + 1].col_aq;
    iRows[iCh] = multi_finish[iCh].row_out;
  }
  iRows[multi_nFinish - 1] = multi_finish[multi_nFinish - 1].row_out;
  if (multi_nFinish > 0)
    ekk_instance_.updateFactor(multi_finish[0].col_aq, multi_finish[0].row_ep,
                               iRows, &rebuild_reason);

  // Determine whether to reinvert based on the synthetic clock
  const double use_build_synthetic_tick =
      ekk_instance_.build_synthetic_tick_ * kMultiBuildSyntheticTickMu;
  const bool reinvert_syntheticClock =
      ekk_instance_.total_synthetic_tick_ >= use_build_synthetic_tick;
  const bool performed_min_updates =
      ekk_instance_.info_.update_count >=
      kMultiSyntheticTickReinversionMinUpdateCount;
  if (reinvert_syntheticClock && performed_min_updates)
    rebuild_reason = kRebuildReasonSyntheticClockSaysInvert;

  delete[] iRows;
}